

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateOptionalNN(Result *__return_storage_ptr__,ModelDescription *description)

{
  int iVar1;
  Rep *pRVar2;
  byte bVar3;
  byte bVar4;
  void **ppvVar5;
  long lVar6;
  undefined1 *puVar7;
  allocator<char> local_31;
  string local_30;
  
  pRVar2 = (description->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  iVar1 = (description->input_).super_RepeatedPtrFieldBase.current_size_;
  bVar3 = 0;
  for (lVar6 = 0; (long)iVar1 << 3 != lVar6; lVar6 = lVar6 + 8) {
    puVar7 = *(undefined1 **)(*(long *)((long)ppvVar5 + lVar6) + 0x20);
    if (puVar7 == (undefined1 *)0x0) {
      puVar7 = Specification::_FeatureType_default_instance_;
    }
    bVar4 = 1;
    if ((*(int *)(puVar7 + 0x24) != 8) && (bVar4 = bVar3, puVar7[0x10] != '\x01'))
    goto LAB_0026d061;
    bVar3 = bVar4;
  }
  if ((bool)(iVar1 < 1 | bVar3)) {
LAB_0026d061:
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"At least one feature for a neural network must NOT be optional."
               ,&local_31);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateOptionalNN(const Specification::ModelDescription& description) {
        // just need to check that not all inputs are optional
        bool hasNotOptional = false;
        for (const auto& input : description.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kStateType) { // ignore optionality for State type input (which is always non-optional)
                hasNotOptional = true;
                continue;
            }
            if (!input.type().isoptional()) {
                hasNotOptional = true;
                break;
            }
        }
        if (description.input().size() > 0 && !hasNotOptional) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "At least one feature for a neural network must NOT be optional.");
        }
        return Result();
    }